

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

Error __thiscall
asmjit::Assembler::_emitOpArray(Assembler *this,uint32_t instId,Operand_ *opArray,size_t opCount)

{
  uint32_t *puVar1;
  anon_union_8_2_78723da6_for_MemData_2 aVar2;
  Error EVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  Operand_ *pOVar4;
  Operand_ *op;
  anon_union_16_7_ed616b9d_for_Operand__0 aVar5;
  
  switch(opCount) {
  case 0:
    opArray = &(this->super_CodeEmitter)._none;
    UNRECOVERED_JUMPTABLE = (this->super_CodeEmitter)._vptr_CodeEmitter[4];
    goto LAB_00159c61;
  case 1:
    UNRECOVERED_JUMPTABLE = (this->super_CodeEmitter)._vptr_CodeEmitter[4];
LAB_00159c61:
    pOVar4 = &(this->super_CodeEmitter)._none;
    EVar3 = (*UNRECOVERED_JUMPTABLE)(this,instId,opArray,pOVar4,pOVar4,pOVar4);
    return EVar3;
  case 2:
    EVar3 = (*(this->super_CodeEmitter)._vptr_CodeEmitter[4])();
    return EVar3;
  case 3:
    goto LAB_00159ca6;
  case 4:
    goto switchD_00159c1c_caseD_4;
  case 5:
    aVar2 = opArray[4].field_0._mem.field_2;
    (this->_op4).field_0._packed[0] = opArray[4].field_0._packed[0];
    (this->_op4).field_0._mem.field_2 = aVar2;
    aVar5 = (anon_union_16_7_ed616b9d_for_Operand__0)(ZEXT816(0) << 0x20);
    break;
  case 6:
    aVar2 = opArray[4].field_0._mem.field_2;
    (this->_op4).field_0._packed[0] = opArray[4].field_0._packed[0];
    (this->_op4).field_0._mem.field_2 = aVar2;
    aVar5 = opArray[5].field_0;
    break;
  default:
    return 3;
  }
  (this->_op5).field_0 = aVar5;
  puVar1 = &(this->super_CodeEmitter)._options;
  *(byte *)puVar1 = (byte)*puVar1 | 8;
switchD_00159c1c_caseD_4:
LAB_00159ca6:
  EVar3 = (*(this->super_CodeEmitter)._vptr_CodeEmitter[4])();
  return EVar3;
}

Assistant:

Error Assembler::_emitOpArray(uint32_t instId, const Operand_* opArray, size_t opCount) {
  const Operand_* op = opArray;
  switch (opCount) {
    case 0: return _emit(instId, _none, _none, _none, _none);
    case 1: return _emit(instId, op[0], _none, _none, _none);
    case 2: return _emit(instId, op[0], op[1], _none, _none);
    case 3: return _emit(instId, op[0], op[1], op[2], _none);
    case 4: return _emit(instId, op[0], op[1], op[2], op[3]);

    case 5:
      _op4 = op[4];
      _op5.reset();
      _options |= kOptionOp4Op5Used;
      return _emit(instId, op[0], op[1], op[2], op[3]);

    case 6:
      _op4 = op[4];
      _op5 = op[5];
      _options |= kOptionOp4Op5Used;
      return _emit(instId, op[0], op[1], op[2], op[3]);

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }
}